

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::CharSetInner::GetNextRange
          (CharSetInner *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar
          )

{
  CharSetNode *pCVar1;
  code *pcVar2;
  char cVar3;
  bool bVar4;
  Char CVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined6 in_register_00000012;
  ulong uVar14;
  ulong uVar15;
  ushort local_38;
  ushort local_36;
  Char local_34;
  Char local_32;
  Char tempLower;
  Char tempHigher;
  Char currentLowChar;
  Char currentHighChar;
  
  uVar9 = (uint)CONCAT62(in_register_00000012,searchCharStart);
  uVar15 = CONCAT62(in_register_00000012,searchCharStart) & 0xffffffff;
  cVar3 = (char)level * '\x04';
  if (uVar9 >> (cVar3 + 8U & 0x1f) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x28e,"(searchCharStart < this->lim(level) + 1)",
                       "searchCharStart < this->lim(level) + 1");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar10 = 0;
  }
  local_34 = L'\0';
  local_32 = L'\0';
  uVar12 = -1 << ((char)level * '\x04' + 4U & 0x1f);
  uVar13 = ~uVar12;
  uVar14 = (ulong)(uVar9 >> (cVar3 + 4U & 0x1f) & 0xf);
  do {
    do {
      uVar11 = uVar14;
      if (uVar11 == 0x10) goto LAB_00cd8454;
      pCVar1 = this->children[uVar11];
      if ((pCVar1 != (CharSetNode *)0x0) &&
         (iVar6 = (*pCVar1->_vptr_CharSetNode[0xc])
                            (pCVar1,(ulong)(level - 1),(ulong)((uint)uVar15 & uVar13 & 0xffff),
                             &local_34,&local_32), (char)iVar6 != '\0')) {
        uVar7 = (uint)uVar11;
        uVar8 = CharSetNode::indexToValue(level,uVar7,(uint)(ushort)local_34);
        local_34 = (Char)uVar8;
        uVar9 = CharSetNode::indexToValue(level,uVar7,(uint)(ushort)local_32);
        local_32 = (Char)uVar9;
        uVar15 = uVar11 & 0xffffffff;
        while( true ) {
          uVar7 = uVar7 + 1;
          CVar5 = (Char)uVar9;
          if (((((uVar9 & 0xffff | uVar12) != 0xffffffff) || (0xe < uVar15)) ||
              (pCVar1 = this->children[uVar15 + 1], CVar5 = local_32, pCVar1 == (CharSetNode *)0x0))
             || ((iVar6 = (*pCVar1->_vptr_CharSetNode[0xc])
                                    (pCVar1,(ulong)(level - 1),0,&local_38,&local_36),
                 CVar5 = local_32, (char)iVar6 == '\0' || ((uVar13 & local_38) != 0)))) break;
          uVar9 = CharSetNode::indexToValue(level,uVar7,(uint)local_36);
          local_32 = (Char)uVar9;
          uVar15 = uVar15 + 1;
        }
        *outLowerChar = local_34;
        *outHigherChar = CVar5;
LAB_00cd8454:
        return uVar11 != 0x10;
      }
      uVar14 = 0x10;
    } while (uVar11 == 0xf);
    uVar14 = uVar11 + 1;
    uVar7 = CharSetNode::indexToValue(level,(uint)uVar14,0);
    uVar15 = (ulong)uVar7;
  } while( true );
}

Assistant:

bool CharSetInner::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < this->lim(level) + 1);
        uint innerIndex = innerIdx(level--, searchCharStart);

        Char currentLowChar = 0, currentHighChar = 0;

        for (; innerIndex < branchingPerInnerLevel; innerIndex++)
        {
            if (children[innerIndex] != nullptr && children[innerIndex]->GetNextRange(level, (Char)remain(level, searchCharStart), &currentLowChar, &currentHighChar))
            {
                break;
            }

            if (innerIndex < branchingPerInnerLevel - 1)
            {
                searchCharStart = (Char)indexToValue(level + 1, innerIndex + 1, 0);
            }
        }

        if (innerIndex == branchingPerInnerLevel)
        {
            return false;
        }

        currentLowChar = (Char)indexToValue(level + 1, innerIndex, currentLowChar);
        currentHighChar = (Char)indexToValue(level + 1, innerIndex, currentHighChar);

        innerIndex += 1;

        for (; remain(level, currentHighChar) == lim(level) && innerIndex < branchingPerInnerLevel; innerIndex++)
        {
            Char tempLower, tempHigher;
            if (children[innerIndex] == nullptr || !children[innerIndex]->GetNextRange(level, 0x0, &tempLower, &tempHigher) || remain(level, tempLower) != 0)
            {
                break;
            }

            currentHighChar = (Char)indexToValue(level + 1, innerIndex, tempHigher);
        }

        *outLowerChar = currentLowChar;
        *outHigherChar = currentHighChar;

        return true;
    }